

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::ExceptionImpl::ExceptionImpl(ExceptionImpl *this,Exception *other)

{
  Exception::Exception(&this->super_Exception,other);
  *(undefined ***)this = &PTR__ExceptionImpl_0030d138;
  (this->whatBuffer).content.ptr = (char *)0x0;
  (this->whatBuffer).content.size_ = 0;
  (this->whatBuffer).content.disposer = (ArrayDisposer *)0x0;
  return;
}

Assistant:

inline ExceptionImpl(Exception&& other): Exception(mv(other)) {}